

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMeshSurface.cpp
# Opt level: O1

void __thiscall chrono::fea::ChMeshSurface::AddFacesFromBoundary(ChMeshSurface *this)

{
  element_type *peVar1;
  ChLoadableUV CVar2;
  bool bVar3;
  ChLoadableUV CVar4;
  size_type sVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  pointer psVar7;
  size_type sVar8;
  _func_int **pp_Var9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  ChLoadableUV CVar13;
  array<chrono::fea::ChNodeFEAxyz_*,_3UL> mface_key;
  ChTetrahedronFace mface_1;
  array<chrono::fea::ChNodeFEAxyz_*,_4UL> mface_key_2;
  multimap<std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_chrono::fea::ChHexahedronFace,_std::less<std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>_>,_std::allocator<std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_chrono::fea::ChHexahedronFace>_>_>
  face_map_hex;
  multimap<std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>,_chrono::fea::ChTetrahedronFace,_std::less<std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>_>,_std::allocator<std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>,_chrono::fea::ChTetrahedronFace>_>_>
  face_map_tet;
  int local_194;
  ChMeshSurface *local_190;
  key_type local_188;
  undefined1 local_168 [8];
  _func_int **local_160;
  undefined1 local_158 [16];
  undefined1 local_148 [48];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_118;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_110;
  undefined1 local_108 [16];
  undefined1 local_f8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_f0;
  ChLoadableUV CStack_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [8];
  _Rb_tree_node_base local_c0;
  size_t local_a0;
  ulong local_98;
  ChHexahedronFace *local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  ChTetrahedronFace *local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  undefined1 local_70 [16];
  _Rb_tree<std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>,_std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>,_chrono::fea::ChTetrahedronFace>,_std::_Select1st<std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>,_chrono::fea::ChTetrahedronFace>_>,_std::less<std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>_>,_std::allocator<std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>,_chrono::fea::ChTetrahedronFace>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  psVar7 = (this->mmesh->velements).
           super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_190 = this;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (((long)(this->mmesh->velements).
             super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
             ._M_impl.super__Vector_impl_data._M_finish - (long)psVar7 & 0xffffffff0U) != 0) {
    pp_Var9 = (_func_int **)0x0;
    do {
      peVar1 = psVar7[(long)pp_Var9].
               super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      CVar2 = (ChLoadableUV)
              psVar7[(long)pp_Var9].
              super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi;
      if (CVar2 != (ChLoadableUV)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)((long)CVar2 + 8) = *(int *)((long)CVar2 + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)((long)CVar2 + 8) = *(int *)((long)CVar2 + 8) + 1;
        }
      }
      local_160 = pp_Var9;
      if (peVar1 == (element_type *)0x0) {
        CVar4 = (ChLoadableUV)0x0;
      }
      else {
        CVar4 = (ChLoadableUV)
                __dynamic_cast(peVar1,&ChElementBase::typeinfo,&ChElementTetrahedron::typeinfo,
                               0xfffffffffffffffe);
      }
      CVar13 = CVar2;
      if (CVar4 == (ChLoadableUV)0x0) {
        CVar13 = (ChLoadableUV)0x0;
      }
      if (CVar4 != (ChLoadableUV)0x0 && CVar2 != (ChLoadableUV)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)((long)CVar2 + 8) = *(int *)((long)CVar2 + 8) + 1;
          UNLOCK();
          CVar13 = CVar2;
        }
        else {
          *(int *)((long)CVar2 + 8) = *(int *)((long)CVar2 + 8) + 1;
          CVar13 = CVar2;
        }
      }
      if (CVar2 != (ChLoadableUV)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CVar2);
      }
      if (CVar4 != (ChLoadableUV)0x0) {
        iVar11 = 0;
        do {
          local_c0._M_parent = (_Base_ptr)CVar4;
          local_c0._M_left = (_Base_ptr)CVar13;
          if (CVar13 == (ChLoadableUV)0x0) {
            local_c8 = (undefined1  [8])&PTR__ChTetrahedronFace_00b524d0;
            local_c0._M_color._0_1_ = (char)iVar11;
          }
          else {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)((long)CVar13 + 8) = *(int *)((long)CVar13 + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)((long)CVar13 + 8) = *(int *)((long)CVar13 + 8) + 1;
            }
            local_c8 = (undefined1  [8])&PTR__ChTetrahedronFace_00b524d0;
            local_c0._M_color._0_1_ = (char)iVar11;
            if (CVar13 != (ChLoadableUV)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)((long)CVar13 + 8) = *(int *)((long)CVar13 + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)((long)CVar13 + 8) = *(int *)((long)CVar13 + 8) + 1;
              }
              if (CVar13 != (ChLoadableUV)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CVar13);
              }
            }
          }
          iVar12 = (int)local_c8;
          ChTetrahedronFace::GetNodeN((ChTetrahedronFace *)local_148,iVar12);
          local_188._M_elems[0] = (ChNodeFEAxyz *)local_148._0_8_;
          ChTetrahedronFace::GetNodeN((ChTetrahedronFace *)local_f8,iVar12);
          local_188._M_elems[1] = (ChNodeFEAxyz *)local_f8;
          ChTetrahedronFace::GetNodeN((ChTetrahedronFace *)local_158,iVar12);
          local_188._M_elems[2] = (ChNodeFEAxyz *)local_158._0_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
          }
          if ((ChLoadableUV)_Stack_f0._M_pi != (ChLoadableUV)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_f0._M_pi);
          }
          if ((ChLoadableUV)local_148._8_8_ != (ChLoadableUV)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_);
          }
          std::__insertion_sort<chrono::fea::ChNodeFEAxyz**,__gnu_cxx::__ops::_Iter_less_iter>
                    (&local_188,local_188._M_elems + 3);
          local_148._16_8_ = local_188._M_elems[2];
          local_148._0_8_ = local_188._M_elems[0];
          local_148._8_8_ = local_188._M_elems[1];
          local_148._24_8_ = &PTR__ChTetrahedronFace_00b524d0;
          local_148[0x20] = (undefined1)local_c0._M_color;
          local_148._40_8_ = local_c0._M_parent;
          local_118._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._M_left;
          if ((ChLoadableUV)local_c0._M_left != (ChLoadableUV)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)((long)local_c0._M_left + 8) = *(int *)((long)local_c0._M_left + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)((long)local_c0._M_left + 8) = *(int *)((long)local_c0._M_left + 8) + 1;
            }
          }
          std::
          _Rb_tree<std::array<chrono::fea::ChNodeFEAxyz*,3ul>,std::pair<std::array<chrono::fea::ChNodeFEAxyz*,3ul>const,chrono::fea::ChTetrahedronFace>,std::_Select1st<std::pair<std::array<chrono::fea::ChNodeFEAxyz*,3ul>const,chrono::fea::ChTetrahedronFace>>,std::less<std::array<chrono::fea::ChNodeFEAxyz*,3ul>>,std::allocator<std::pair<std::array<chrono::fea::ChNodeFEAxyz*,3ul>const,chrono::fea::ChTetrahedronFace>>>
          ::
          _M_insert_equal<std::pair<std::array<chrono::fea::ChNodeFEAxyz*,3ul>const,chrono::fea::ChTetrahedronFace>>
                    ((_Rb_tree<std::array<chrono::fea::ChNodeFEAxyz*,3ul>,std::pair<std::array<chrono::fea::ChNodeFEAxyz*,3ul>const,chrono::fea::ChTetrahedronFace>,std::_Select1st<std::pair<std::array<chrono::fea::ChNodeFEAxyz*,3ul>const,chrono::fea::ChTetrahedronFace>>,std::less<std::array<chrono::fea::ChNodeFEAxyz*,3ul>>,std::allocator<std::pair<std::array<chrono::fea::ChNodeFEAxyz*,3ul>const,chrono::fea::ChTetrahedronFace>>>
                      *)&local_60,
                     (pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>,_chrono::fea::ChTetrahedronFace>
                      *)local_148);
          local_148._24_8_ = &PTR__ChTetrahedronFace_00b524d0;
          if ((ChLoadableUV)local_118._M_pi != (ChLoadableUV)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_118._M_pi);
          }
          local_c8 = (undefined1  [8])&PTR__ChTetrahedronFace_00b524d0;
          if ((ChLoadableUV)local_c0._M_left != (ChLoadableUV)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._M_left);
          }
          iVar11 = iVar11 + 1;
        } while (iVar11 != 4);
      }
      if (CVar13 != (ChLoadableUV)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CVar13);
      }
      pp_Var9 = (_func_int **)((long)local_160 + 1);
      psVar7 = (local_190->mmesh->velements).
               super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (pp_Var9 < (_func_int **)
                       ((ulong)((long)(local_190->mmesh->velements).
                                      super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar7) >>
                        4 & 0xffffffff));
  }
  psVar7 = (local_190->mmesh->velements).
           super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (((long)(local_190->mmesh->velements).
             super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
             ._M_impl.super__Vector_impl_data._M_finish - (long)psVar7 & 0xffffffff0U) != 0) {
    uVar10 = 0;
    local_160 = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b527e8;
    do {
      peVar1 = psVar7[uVar10].
               super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      CVar2 = (ChLoadableUV)
              psVar7[uVar10].
              super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi;
      if (CVar2 != (ChLoadableUV)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)((long)CVar2 + 8) = *(int *)((long)CVar2 + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)((long)CVar2 + 8) = *(int *)((long)CVar2 + 8) + 1;
        }
      }
      local_98 = uVar10;
      if (peVar1 == (element_type *)0x0) {
        local_188._M_elems[0] = (ChNodeFEAxyz *)0x0;
      }
      else {
        local_188._M_elems[0] =
             (ChNodeFEAxyz *)
             __dynamic_cast(peVar1,&ChElementBase::typeinfo,&ChElementTetrahedron::typeinfo,
                            0xfffffffffffffffe);
      }
      if ((ChLoadableUV)local_188._M_elems[0] == (ChLoadableUV)0x0) {
        local_188._M_elems[0] = (ChNodeFEAxyz *)0x0;
        local_188._M_elems[1] = (ChNodeFEAxyz *)0x0;
LAB_0064a217:
        if (CVar2 != (ChLoadableUV)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CVar2);
        }
      }
      else {
        local_188._M_elems[1] = (ChNodeFEAxyz *)CVar2;
        if (CVar2 != (ChLoadableUV)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)((long)CVar2 + 8) = *(int *)((long)CVar2 + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)((long)CVar2 + 8) = *(int *)((long)CVar2 + 8) + 1;
          }
          goto LAB_0064a217;
        }
      }
      if ((ChLoadableUV)local_188._M_elems[0] != (ChLoadableUV)0x0) {
        local_108._0_4_ = 0;
        do {
          if ((ChLoadableUV)local_188._M_elems[1] == (ChLoadableUV)0x0) {
            local_148._0_8_ = &PTR__ChTetrahedronFace_00b524d0;
            local_148[8] = local_108[0];
            local_148._16_8_ = local_188._M_elems[0];
            local_148._24_8_ = local_188._M_elems[1];
          }
          else {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)((long)local_188._M_elems[1] + 8) =
                   *(int *)((long)local_188._M_elems[1] + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)((long)local_188._M_elems[1] + 8) =
                   *(int *)((long)local_188._M_elems[1] + 8) + 1;
            }
            local_148._0_8_ = &PTR__ChTetrahedronFace_00b524d0;
            local_148[8] = local_108[0];
            local_148._16_8_ = local_188._M_elems[0];
            local_148._24_8_ = local_188._M_elems[1];
            if ((ChLoadableUV)local_188._M_elems[1] != (ChLoadableUV)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)((long)local_188._M_elems[1] + 8) =
                     *(int *)((long)local_188._M_elems[1] + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)((long)local_188._M_elems[1] + 8) =
                     *(int *)((long)local_188._M_elems[1] + 8) + 1;
              }
              if ((ChLoadableUV)local_188._M_elems[1] != (ChLoadableUV)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._M_elems[1]);
              }
            }
          }
          iVar11 = (int)local_148;
          ChTetrahedronFace::GetNodeN((ChTetrahedronFace *)local_f8,iVar11);
          local_c8 = local_f8;
          ChTetrahedronFace::GetNodeN((ChTetrahedronFace *)local_158,iVar11);
          local_c0._0_8_ = local_158._0_8_;
          ChTetrahedronFace::GetNodeN((ChTetrahedronFace *)local_d8,iVar11);
          local_c0._M_parent = (_Base_ptr)local_d8._0_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
          }
          if ((ChLoadableUV)_Stack_f0._M_pi != (ChLoadableUV)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_f0._M_pi);
          }
          std::__insertion_sort<chrono::fea::ChNodeFEAxyz**,__gnu_cxx::__ops::_Iter_less_iter>
                    ((key_type *)local_c8,&local_c0._M_left);
          sVar5 = std::
                  _Rb_tree<std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>,_std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>,_chrono::fea::ChTetrahedronFace>,_std::_Select1st<std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>,_chrono::fea::ChTetrahedronFace>_>,_std::less<std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>_>,_std::allocator<std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>,_chrono::fea::ChTetrahedronFace>_>_>
                  ::count(&local_60,(key_type *)local_c8);
          if (sVar5 == 1) {
            p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x30);
            p_Var6->_M_use_count = 1;
            p_Var6->_M_weak_count = 1;
            p_Var6->_vptr__Sp_counted_base = local_160;
            __gnu_cxx::new_allocator<chrono::fea::ChTetrahedronFace>::
            construct<chrono::fea::ChTetrahedronFace,std::shared_ptr<chrono::fea::ChElementTetrahedron>&,int&>
                      ((new_allocator<chrono::fea::ChTetrahedronFace> *)local_f8,
                       (ChTetrahedronFace *)(p_Var6 + 1),
                       (shared_ptr<chrono::fea::ChElementTetrahedron> *)&local_188,(int *)local_108)
            ;
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            }
            local_80 = (ChTetrahedronFace *)(p_Var6 + 1);
            local_78 = p_Var6;
            (*local_190->_vptr_ChMeshSurface[2])(local_190,&local_80);
            if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
            }
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
          }
          local_148._0_8_ = &PTR__ChTetrahedronFace_00b524d0;
          if ((ChLoadableUV)local_148._24_8_ != (ChLoadableUV)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._24_8_);
          }
          iVar11 = local_108._0_4_ + 1;
          bVar3 = (int)local_108._0_4_ < 3;
          local_108._0_4_ = iVar11;
        } while (bVar3);
      }
      if ((ChLoadableUV)local_188._M_elems[1] != (ChLoadableUV)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._M_elems[1]);
      }
      uVar10 = local_98 + 1;
      psVar7 = (local_190->mmesh->velements).
               super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar10 < ((ulong)((long)(local_190->mmesh->velements).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)psVar7) >> 4
                      & 0xffffffff));
  }
  local_c0._M_left = &local_c0;
  local_c0._0_8_ = local_c0._0_8_ & 0xffffffff00000000;
  local_c0._M_parent = (_Base_ptr)0x0;
  local_a0 = 0;
  psVar7 = (local_190->mmesh->velements).
           super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_c0._M_right = local_c0._M_left;
  if (((long)(local_190->mmesh->velements).
             super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
             ._M_impl.super__Vector_impl_data._M_finish - (long)psVar7 & 0xffffffff0U) != 0) {
    pp_Var9 = (_func_int **)0x0;
    do {
      peVar1 = psVar7[(long)pp_Var9].
               super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      CVar2 = (ChLoadableUV)
              psVar7[(long)pp_Var9].
              super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi;
      if (CVar2 != (ChLoadableUV)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)((long)CVar2 + 8) = *(int *)((long)CVar2 + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)((long)CVar2 + 8) = *(int *)((long)CVar2 + 8) + 1;
        }
      }
      local_160 = pp_Var9;
      if (peVar1 == (element_type *)0x0) {
        CVar4 = (ChLoadableUV)0x0;
      }
      else {
        CVar4 = (ChLoadableUV)
                __dynamic_cast(peVar1,&ChElementBase::typeinfo,&ChElementHexahedron::typeinfo,
                               0xfffffffffffffffe);
      }
      CVar13 = CVar2;
      if (CVar4 == (ChLoadableUV)0x0) {
        CVar13 = (ChLoadableUV)0x0;
      }
      if (CVar4 != (ChLoadableUV)0x0 && CVar2 != (ChLoadableUV)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)((long)CVar2 + 8) = *(int *)((long)CVar2 + 8) + 1;
          UNLOCK();
          CVar13 = CVar2;
        }
        else {
          *(int *)((long)CVar2 + 8) = *(int *)((long)CVar2 + 8) + 1;
          CVar13 = CVar2;
        }
      }
      if (CVar2 != (ChLoadableUV)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CVar2);
      }
      if (CVar4 != (ChLoadableUV)0x0) {
        iVar11 = 0;
        do {
          local_188._M_elems[2] = (ChNodeFEAxyz *)CVar4;
          local_188._M_elems[3] = (ChNodeFEAxyz *)CVar13;
          if (CVar13 == (ChLoadableUV)0x0) {
            local_188._M_elems[0] = (ChNodeFEAxyz *)&PTR__ChHexahedronFace_00b525e0;
            local_188._M_elems[1] =
                 (ChNodeFEAxyz *)CONCAT71(local_188._M_elems[1]._1_7_,(char)iVar11);
          }
          else {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)((long)CVar13 + 8) = *(int *)((long)CVar13 + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)((long)CVar13 + 8) = *(int *)((long)CVar13 + 8) + 1;
            }
            local_188._M_elems[0] = (ChNodeFEAxyz *)&PTR__ChHexahedronFace_00b525e0;
            local_188._M_elems[1] =
                 (ChNodeFEAxyz *)CONCAT71(local_188._M_elems[1]._1_7_,(char)iVar11);
            if (CVar13 != (ChLoadableUV)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)((long)CVar13 + 8) = *(int *)((long)CVar13 + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)((long)CVar13 + 8) = *(int *)((long)CVar13 + 8) + 1;
              }
              if (CVar13 != (ChLoadableUV)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CVar13);
              }
            }
          }
          iVar12 = (int)&local_188;
          ChHexahedronFace::GetNodeN((ChHexahedronFace *)local_148,iVar12);
          local_f8 = (undefined1  [8])local_148._0_8_;
          ChHexahedronFace::GetNodeN((ChHexahedronFace *)local_158,iVar12);
          _Stack_f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._0_8_;
          ChHexahedronFace::GetNodeN((ChHexahedronFace *)local_d8,iVar12);
          CStack_e8 = (ChLoadableUV)local_d8._0_8_;
          ChHexahedronFace::GetNodeN((ChHexahedronFace *)local_108,iVar12);
          _Stack_e0._M_pi._4_4_ = local_108._4_4_;
          _Stack_e0._M_pi._0_4_ = local_108._0_4_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
          }
          if ((ChLoadableUV)local_148._8_8_ != (ChLoadableUV)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_);
          }
          std::__insertion_sort<chrono::fea::ChNodeFEAxyz**,__gnu_cxx::__ops::_Iter_less_iter>
                    (local_f8,local_d8);
          local_148._0_8_ = local_f8;
          local_148._8_8_ = _Stack_f0._M_pi;
          local_148._16_8_ = CStack_e8;
          local_148._24_8_ = _Stack_e0._M_pi;
          local_148._32_8_ = &PTR__ChHexahedronFace_00b525e0;
          local_148[0x28] = local_188._M_elems[1]._0_1_;
          local_118._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._M_elems[2];
          local_110._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._M_elems[3];
          if ((ChLoadableUV)local_188._M_elems[3] != (ChLoadableUV)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)((long)local_188._M_elems[3] + 8) =
                   *(int *)((long)local_188._M_elems[3] + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)((long)local_188._M_elems[3] + 8) =
                   *(int *)((long)local_188._M_elems[3] + 8) + 1;
            }
          }
          std::
          _Rb_tree<std::array<chrono::fea::ChNodeFEAxyz*,4ul>,std::pair<std::array<chrono::fea::ChNodeFEAxyz*,4ul>const,chrono::fea::ChHexahedronFace>,std::_Select1st<std::pair<std::array<chrono::fea::ChNodeFEAxyz*,4ul>const,chrono::fea::ChHexahedronFace>>,std::less<std::array<chrono::fea::ChNodeFEAxyz*,4ul>>,std::allocator<std::pair<std::array<chrono::fea::ChNodeFEAxyz*,4ul>const,chrono::fea::ChHexahedronFace>>>
          ::
          _M_insert_equal<std::pair<std::array<chrono::fea::ChNodeFEAxyz*,4ul>const,chrono::fea::ChHexahedronFace>>
                    ((_Rb_tree<std::array<chrono::fea::ChNodeFEAxyz*,4ul>,std::pair<std::array<chrono::fea::ChNodeFEAxyz*,4ul>const,chrono::fea::ChHexahedronFace>,std::_Select1st<std::pair<std::array<chrono::fea::ChNodeFEAxyz*,4ul>const,chrono::fea::ChHexahedronFace>>,std::less<std::array<chrono::fea::ChNodeFEAxyz*,4ul>>,std::allocator<std::pair<std::array<chrono::fea::ChNodeFEAxyz*,4ul>const,chrono::fea::ChHexahedronFace>>>
                      *)local_c8,
                     (pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_chrono::fea::ChHexahedronFace>
                      *)local_148);
          local_148._32_8_ = &PTR__ChHexahedronFace_00b525e0;
          if ((ChNodeFEAxyz *)local_110._M_pi != (ChNodeFEAxyz *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_110._M_pi);
          }
          local_188._M_elems[0] = (ChNodeFEAxyz *)&PTR__ChHexahedronFace_00b525e0;
          if ((ChLoadableUV)local_188._M_elems[3] != (ChLoadableUV)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._M_elems[3]);
          }
          iVar11 = iVar11 + 1;
        } while (iVar11 != 6);
      }
      if (CVar13 != (ChLoadableUV)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CVar13);
      }
      pp_Var9 = (_func_int **)((long)local_160 + 1);
      psVar7 = (local_190->mmesh->velements).
               super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (pp_Var9 < (_func_int **)
                       ((ulong)((long)(local_190->mmesh->velements).
                                      super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar7) >>
                        4 & 0xffffffff));
  }
  psVar7 = (local_190->mmesh->velements).
           super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (((long)(local_190->mmesh->velements).
             super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
             ._M_impl.super__Vector_impl_data._M_finish - (long)psVar7 & 0xffffffff0U) != 0) {
    uVar10 = 0;
    local_160 = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b52838;
    do {
      peVar1 = psVar7[uVar10].
               super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      CVar2 = (ChLoadableUV)
              psVar7[uVar10].
              super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi;
      if (CVar2 != (ChLoadableUV)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)((long)CVar2 + 8) = *(int *)((long)CVar2 + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)((long)CVar2 + 8) = *(int *)((long)CVar2 + 8) + 1;
        }
      }
      local_98 = uVar10;
      if (peVar1 == (element_type *)0x0) {
        local_f8 = (undefined1  [8])0x0;
      }
      else {
        local_f8 = (undefined1  [8])
                   __dynamic_cast(peVar1,&ChElementBase::typeinfo,&ChElementHexahedron::typeinfo,
                                  0xfffffffffffffffe);
      }
      if ((ChLoadableUV)local_f8 == (ChLoadableUV)0x0) {
        local_f8 = (undefined1  [8])0x0;
        _Stack_f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_0064a886:
        if (CVar2 != (ChLoadableUV)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CVar2);
        }
      }
      else {
        _Stack_f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CVar2;
        if (CVar2 != (ChLoadableUV)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)((long)CVar2 + 8) = *(int *)((long)CVar2 + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)((long)CVar2 + 8) = *(int *)((long)CVar2 + 8) + 1;
          }
          goto LAB_0064a886;
        }
      }
      if ((ChLoadableUV)local_f8 != (ChLoadableUV)0x0) {
        local_194 = 0;
        do {
          if ((ChLoadableUV)_Stack_f0._M_pi == (ChLoadableUV)0x0) {
            local_148._0_8_ = &PTR__ChHexahedronFace_00b525e0;
            local_148[8] = (undefined1)local_194;
            local_148._16_8_ = local_f8;
            local_148._24_8_ = _Stack_f0._M_pi;
          }
          else {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (_Stack_f0._M_pi)->_M_use_count = (_Stack_f0._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (_Stack_f0._M_pi)->_M_use_count = (_Stack_f0._M_pi)->_M_use_count + 1;
            }
            local_148._0_8_ = &PTR__ChHexahedronFace_00b525e0;
            local_148[8] = (undefined1)local_194;
            local_148._16_8_ = local_f8;
            local_148._24_8_ = _Stack_f0._M_pi;
            if ((ChLoadableUV)_Stack_f0._M_pi != (ChLoadableUV)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (_Stack_f0._M_pi)->_M_use_count = (_Stack_f0._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (_Stack_f0._M_pi)->_M_use_count = (_Stack_f0._M_pi)->_M_use_count + 1;
              }
              if ((ChLoadableUV)_Stack_f0._M_pi != (ChLoadableUV)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_f0._M_pi);
              }
            }
          }
          iVar11 = (int)local_148;
          ChHexahedronFace::GetNodeN((ChHexahedronFace *)local_158,iVar11);
          local_188._M_elems[0] = (ChNodeFEAxyz *)local_158._0_8_;
          ChHexahedronFace::GetNodeN((ChHexahedronFace *)local_d8,iVar11);
          local_188._M_elems[1] = (ChNodeFEAxyz *)local_d8._0_8_;
          ChHexahedronFace::GetNodeN((ChHexahedronFace *)local_108,iVar11);
          local_188._M_elems[2]._4_4_ = local_108._4_4_;
          local_188._M_elems[2]._0_4_ = local_108._0_4_;
          ChHexahedronFace::GetNodeN((ChHexahedronFace *)local_70,iVar11);
          local_188._M_elems[3] = (ChNodeFEAxyz *)local_70._0_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
          }
          std::__insertion_sort<chrono::fea::ChNodeFEAxyz**,__gnu_cxx::__ops::_Iter_less_iter>
                    (&local_188,local_168);
          sVar8 = std::
                  _Rb_tree<std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_chrono::fea::ChHexahedronFace>,_std::_Select1st<std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_chrono::fea::ChHexahedronFace>_>,_std::less<std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>_>,_std::allocator<std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_chrono::fea::ChHexahedronFace>_>_>
                  ::count((_Rb_tree<std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_chrono::fea::ChHexahedronFace>,_std::_Select1st<std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_chrono::fea::ChHexahedronFace>_>,_std::less<std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>_>,_std::allocator<std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_chrono::fea::ChHexahedronFace>_>_>
                           *)local_c8,&local_188);
          if (sVar8 == 1) {
            p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x30);
            p_Var6->_M_use_count = 1;
            p_Var6->_M_weak_count = 1;
            p_Var6->_vptr__Sp_counted_base = local_160;
            __gnu_cxx::new_allocator<chrono::fea::ChHexahedronFace>::
            construct<chrono::fea::ChHexahedronFace,std::shared_ptr<chrono::fea::ChElementHexahedron>&,int&>
                      ((new_allocator<chrono::fea::ChHexahedronFace> *)local_158,
                       (ChHexahedronFace *)(p_Var6 + 1),
                       (shared_ptr<chrono::fea::ChElementHexahedron> *)local_f8,&local_194);
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            }
            local_90 = (ChHexahedronFace *)(p_Var6 + 1);
            local_88 = p_Var6;
            (*local_190->_vptr_ChMeshSurface[2])(local_190,&local_90);
            if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
            }
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
          }
          local_148._0_8_ = &PTR__ChHexahedronFace_00b525e0;
          if ((ChLoadableUV)local_148._24_8_ != (ChLoadableUV)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._24_8_);
          }
          iVar11 = local_194 + 1;
          bVar3 = local_194 < 5;
          local_194 = iVar11;
        } while (bVar3);
      }
      if ((ChLoadableUV)_Stack_f0._M_pi != (ChLoadableUV)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_f0._M_pi);
      }
      uVar10 = local_98 + 1;
      psVar7 = (local_190->mmesh->velements).
               super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar10 < ((ulong)((long)(local_190->mmesh->velements).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)psVar7) >> 4
                      & 0xffffffff));
  }
  std::
  _Rb_tree<std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_chrono::fea::ChHexahedronFace>,_std::_Select1st<std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_chrono::fea::ChHexahedronFace>_>,_std::less<std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>_>,_std::allocator<std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_chrono::fea::ChHexahedronFace>_>_>
  ::~_Rb_tree((_Rb_tree<std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_chrono::fea::ChHexahedronFace>,_std::_Select1st<std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_chrono::fea::ChHexahedronFace>_>,_std::less<std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>_>,_std::allocator<std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_chrono::fea::ChHexahedronFace>_>_>
               *)local_c8);
  std::
  _Rb_tree<std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>,_std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>,_chrono::fea::ChTetrahedronFace>,_std::_Select1st<std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>,_chrono::fea::ChTetrahedronFace>_>,_std::less<std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>_>,_std::allocator<std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>,_chrono::fea::ChTetrahedronFace>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void ChMeshSurface::AddFacesFromBoundary() {
    // Boundary faces of TETRAHEDRONS
    std::multimap<std::array<ChNodeFEAxyz*, 3>, ChTetrahedronFace> face_map_tet;

    for (unsigned int ie = 0; ie < this->mmesh->GetNelements(); ++ie) {
        if (auto mtetra = std::dynamic_pointer_cast<ChElementTetrahedron>(mmesh->GetElement(ie))) {
            for (int nface = 0; nface < 4; ++nface) {
                ChTetrahedronFace mface(mtetra, nface);
                std::array<ChNodeFEAxyz*, 3> mface_key = {mface.GetNodeN(0).get(), mface.GetNodeN(1).get(),
                                                          mface.GetNodeN(2).get()};
                std::sort(mface_key.begin(), mface_key.end());
                face_map_tet.insert({mface_key, mface});
            }
        }
    }
    for (unsigned int ie = 0; ie < this->mmesh->GetNelements(); ++ie) {
        if (auto mtetra = std::dynamic_pointer_cast<ChElementTetrahedron>(mmesh->GetElement(ie))) {
            for (int nface = 0; nface < 4; ++nface) {
                ChTetrahedronFace mface(mtetra, nface);
                std::array<ChNodeFEAxyz*, 3> mface_key = {mface.GetNodeN(0).get(), mface.GetNodeN(1).get(),
                                                          mface.GetNodeN(2).get()};
                std::sort(mface_key.begin(), mface_key.end());
                if (face_map_tet.count(mface_key) == 1) {
                    // Found a face that is not shared.. so it is a boundary face.
                    // Instance it to be handled via shared ptr, and add it to list...
                    auto boundary_face = chrono_types::make_shared<ChTetrahedronFace>(mtetra, nface);
                    this->AddFace(boundary_face);
                }
            }
        }
    }

    // Boundary faces of HEXAHEDRONS
    std::multimap<std::array<ChNodeFEAxyz*, 4>, ChHexahedronFace> face_map_hex;

    for (unsigned int ie = 0; ie < mmesh->GetNelements(); ++ie) {
        if (auto mbrick = std::dynamic_pointer_cast<ChElementHexahedron>(mmesh->GetElement(ie))) {
            for (int nface = 0; nface < 6; ++nface) {
                ChHexahedronFace mface(mbrick, nface);
                std::array<ChNodeFEAxyz*, 4> mface_key = {mface.GetNodeN(0).get(), mface.GetNodeN(1).get(),
                                                          mface.GetNodeN(2).get(), mface.GetNodeN(3).get()};
                std::sort(mface_key.begin(), mface_key.end());
                face_map_hex.insert({mface_key, mface});
            }
        }
    }
    for (unsigned int ie = 0; ie < mmesh->GetNelements(); ++ie) {
        if (auto mbrick = std::dynamic_pointer_cast<ChElementHexahedron>(mmesh->GetElement(ie))) {
            for (int nface = 0; nface < 6; ++nface) {
                ChHexahedronFace mface(mbrick, nface);
                std::array<ChNodeFEAxyz*, 4> mface_key = {mface.GetNodeN(0).get(), mface.GetNodeN(1).get(),
                                                          mface.GetNodeN(2).get(), mface.GetNodeN(3).get()};
                std::sort(mface_key.begin(), mface_key.end());
                if (face_map_hex.count(mface_key) == 1) {
                    // Found a face that is not shared.. so it is a boundary face.
                    // Instance it to be handled via shared ptr, and add it to list...
                    auto boundary_face = chrono_types::make_shared<ChHexahedronFace>(mbrick, nface);
                    this->AddFace(boundary_face);
                }
            }
        }
    }
}